

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O3

bool short_parsing_fails(void)

{
  undefined1 uVar1;
  long local_1c8;
  stringstream ss;
  byte abStack_1a8 [96];
  ios_base local_148 [264];
  undefined1 *local_40;
  short v;
  undefined1 local_30 [16];
  locale local_20 [8];
  
  uVar1 = short_parsing_fails::fails;
  if (short_parsing_fails()::get_result != '\x01') {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"65000","");
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&local_1c8,(string *)&local_40,_S_out|_S_in);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    std::locale::classic();
    std::ios::imbue(local_20);
    std::locale::~locale(local_20);
    local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffff0000);
    std::istream::operator>>((istream *)&local_1c8,(short *)&local_40);
    uVar1 = (abStack_1a8[*(long *)(local_1c8 + -0x18)] & 5) != 0;
    short_parsing_fails()::get_result = '\x01';
    short_parsing_fails::fails = (bool)uVar1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8);
    std::ios_base::~ios_base(local_148);
  }
  return (bool)uVar1;
}

Assistant:

bool short_parsing_fails()
{
    static bool fails = false;
    static bool get_result = false;
    if(get_result)
        return fails;
    std::stringstream ss("65000");
    ss.imbue(std::locale::classic());
    short v=0;
    ss >> v;
    fails = ss.fail();
    get_result = true;
    return fails;
}